

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x4.c
# Opt level: O0

void image_u8x4_write_pam(image_u8x4_t *im,char *path)

{
  FILE *__stream;
  int local_24;
  int y;
  FILE *f;
  char *path_local;
  image_u8x4_t *im_local;
  
  __stream = fopen(path,"w");
  fprintf(__stream,"P7\n");
  fprintf(__stream,"WIDTH %d\n",(ulong)(uint)im->width);
  fprintf(__stream,"HEIGHT %d\n",(ulong)(uint)im->height);
  fprintf(__stream,"DEPTH 4\n");
  fprintf(__stream,"MAXVAL 255\n");
  fprintf(__stream,"TUPLTYPE RGB_ALPHA\n");
  fprintf(__stream,"ENDHDR\n");
  for (local_24 = 0; local_24 < im->height; local_24 = local_24 + 1) {
    fwrite(im->buf + local_24 * im->stride,1,(long)(im->width << 2),__stream);
  }
  fclose(__stream);
  return;
}

Assistant:

void image_u8x4_write_pam(const image_u8x4_t *im, const char *path)
{
    FILE *f = fopen(path, "w");
    fprintf(f, "P7\n");
    fprintf(f, "WIDTH %d\n", im->width);
    fprintf(f, "HEIGHT %d\n", im->height);
    fprintf(f, "DEPTH 4\n");
    fprintf(f, "MAXVAL 255\n");
    fprintf(f, "TUPLTYPE RGB_ALPHA\n");
    fprintf(f, "ENDHDR\n");

    for (int y = 0; y < im->height; y++)
        fwrite(&im->buf[y*im->stride], 1, 4*im->width, f);

    fclose(f);

}